

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

void __thiscall slang::SVInt::setAllX(SVInt *this)

{
  uint uVar1;
  uint64_t *puVar2;
  uint32_t i;
  uint uVar3;
  ulong uVar4;
  
  uVar1 = (this->super_SVIntStorage).bitWidth;
  uVar3 = uVar1 + 0x3f >> 6;
  uVar4 = (ulong)uVar3;
  if ((this->super_SVIntStorage).unknownFlag == true) {
    memset((this->super_SVIntStorage).field_0.pVal,0,(ulong)(uVar3 * 8));
  }
  else {
    if ((0x40 < uVar1) &&
       (puVar2 = (this->super_SVIntStorage).field_0.pVal, puVar2 != (uint64_t *)0x0)) {
      operator_delete__(puVar2);
    }
    (this->super_SVIntStorage).unknownFlag = true;
    puVar2 = (uint64_t *)operator_new__((ulong)(uVar3 << 4));
    memset(puVar2,0,(ulong)(uVar3 << 4));
    (this->super_SVIntStorage).field_0.pVal = puVar2;
  }
  for (; uVar4 < uVar3 * 2; uVar4 = uVar4 + 1) {
    (this->super_SVIntStorage).field_0.pVal[uVar4] = 0xffffffffffffffff;
  }
  clearUnusedBits(this);
  return;
}

Assistant:

void SVInt::setAllX() {
    // first set low half to zero (for X)
    uint32_t words = getNumWords(bitWidth, false);
    if (unknownFlag)
        memset(pVal, 0, words * WORD_SIZE);
    else {
        if (!isSingleWord())
            delete[] pVal;

        unknownFlag = true;
        pVal = new uint64_t[words * 2]();
    }

    // now set upper half to ones (for unknown)
    for (uint32_t i = words; i < words * 2; i++)
        pVal[i] = UINT64_MAX;
    clearUnusedBits();
}